

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<8,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::QuadMiMBIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  Scene *pSVar6;
  Ref<embree::Geometry> *pRVar7;
  Geometry *pGVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  byte bVar82;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  AABBNodeMB4D *node1;
  ulong uVar110;
  long lVar111;
  long lVar112;
  int iVar113;
  uint uVar114;
  undefined1 (*pauVar115) [16];
  long lVar116;
  ulong uVar117;
  ulong uVar118;
  ulong uVar119;
  ulong uVar120;
  long lVar121;
  uint uVar122;
  ulong uVar123;
  ulong uVar124;
  long lVar125;
  ulong uVar126;
  ulong uVar127;
  ulong uVar128;
  ulong uVar129;
  ulong uVar130;
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [64];
  undefined1 auVar136 [16];
  undefined1 auVar138 [32];
  undefined1 auVar137 [16];
  float fVar146;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar145;
  undefined1 auVar144 [64];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar147;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [64];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar175 [32];
  undefined1 auVar174 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [64];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [64];
  float fVar182;
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  float fVar189;
  undefined1 auVar185 [32];
  float fVar187;
  float fVar188;
  float fVar190;
  float fVar191;
  float fVar192;
  undefined1 auVar186 [64];
  undefined1 auVar193 [32];
  uint uVar195;
  uint uVar196;
  uint uVar197;
  uint uVar198;
  uint uVar199;
  uint uVar200;
  undefined1 auVar194 [64];
  undefined1 auVar201 [32];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  float fVar204;
  undefined1 auVar205 [16];
  float fVar210;
  undefined1 auVar206 [32];
  float fVar208;
  float fVar209;
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar207 [64];
  undefined1 auVar214 [32];
  undefined1 auVar215 [64];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [16];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 (*local_2918) [16];
  int local_28ec;
  RayQueryContext *local_28e8;
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [8];
  float fStack_2898;
  float fStack_2894;
  undefined1 local_2890 [8];
  float fStack_2888;
  float fStack_2884;
  ulong local_2880;
  long local_2878;
  ulong local_2870;
  ulong local_2868;
  ulong local_2860;
  long local_2858;
  ulong local_2850;
  ulong local_2848;
  ulong local_2840;
  ulong local_2838;
  RTCFilterFunctionNArguments local_2830;
  undefined1 local_2800 [32];
  float local_27d0;
  float local_27cc;
  float local_27c8;
  float local_27c4;
  float local_27c0;
  undefined4 local_27bc;
  uint local_27b8;
  uint local_27b4;
  uint local_27b0;
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [8];
  float fStack_2738;
  float fStack_2734;
  undefined1 local_2730 [8];
  float fStack_2728;
  float fStack_2724;
  undefined1 local_2720 [8];
  float fStack_2718;
  float fStack_2714;
  undefined1 local_2710 [8];
  float fStack_2708;
  float fStack_2704;
  undefined1 local_2700 [8];
  float fStack_26f8;
  float fStack_26f4;
  undefined1 local_26f0 [8];
  float fStack_26e8;
  float fStack_26e4;
  undefined1 local_26e0 [8];
  float fStack_26d8;
  float fStack_26d4;
  undefined1 local_26d0 [8];
  float fStack_26c8;
  float fStack_26c4;
  undefined1 local_26c0 [8];
  float fStack_26b8;
  float fStack_26b4;
  undefined1 local_26b0 [16];
  undefined1 local_26a0 [32];
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25c0 [32];
  float local_25a0 [4];
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  undefined4 uStack_2584;
  float local_2580 [4];
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  undefined4 uStack_2564;
  undefined1 local_2560 [32];
  float local_2540 [4];
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  undefined4 uStack_2524;
  float local_2520 [4];
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  undefined4 uStack_2504;
  float local_2500 [4];
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  undefined4 uStack_24e4;
  undefined1 local_24e0 [8];
  float fStack_24d8;
  float fStack_24d4;
  float fStack_24d0;
  float fStack_24cc;
  float fStack_24c8;
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  undefined1 auVar171 [64];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    local_2918 = (undefined1 (*) [16])local_2390;
    uStack_2398 = 0;
    aVar5 = (ray->super_RayK<1>).dir.field_0;
    auVar136 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3])
                         );
    fVar147 = (ray->super_RayK<1>).tfar;
    auVar144 = ZEXT464((uint)fVar147);
    auVar148 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar147));
    auVar162._8_4_ = 0x7fffffff;
    auVar162._0_8_ = 0x7fffffff7fffffff;
    auVar162._12_4_ = 0x7fffffff;
    auVar162 = vandps_avx((undefined1  [16])aVar5,auVar162);
    auVar172._8_4_ = 0x219392ef;
    auVar172._0_8_ = 0x219392ef219392ef;
    auVar172._12_4_ = 0x219392ef;
    auVar162 = vcmpps_avx(auVar162,auVar172,1);
    auVar162 = vblendvps_avx((undefined1  [16])aVar5,auVar172,auVar162);
    auVar172 = vrcpps_avx(auVar162);
    fVar147 = auVar172._0_4_;
    auVar160._0_4_ = auVar162._0_4_ * fVar147;
    fVar155 = auVar172._4_4_;
    auVar160._4_4_ = auVar162._4_4_ * fVar155;
    fVar156 = auVar172._8_4_;
    auVar160._8_4_ = auVar162._8_4_ * fVar156;
    fVar157 = auVar172._12_4_;
    auVar160._12_4_ = auVar162._12_4_ * fVar157;
    auVar173._8_4_ = 0x3f800000;
    auVar173._0_8_ = 0x3f8000003f800000;
    auVar173._12_4_ = 0x3f800000;
    auVar162 = vsubps_avx(auVar173,auVar160);
    auVar161._0_4_ = fVar147 + fVar147 * auVar162._0_4_;
    auVar161._4_4_ = fVar155 + fVar155 * auVar162._4_4_;
    auVar161._8_4_ = fVar156 + fVar156 * auVar162._8_4_;
    auVar161._12_4_ = fVar157 + fVar157 * auVar162._12_4_;
    uVar3 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_23e0._4_4_ = uVar3;
    local_23e0._0_4_ = uVar3;
    local_23e0._8_4_ = uVar3;
    local_23e0._12_4_ = uVar3;
    local_23e0._16_4_ = uVar3;
    local_23e0._20_4_ = uVar3;
    local_23e0._24_4_ = uVar3;
    local_23e0._28_4_ = uVar3;
    auVar181 = ZEXT3264(local_23e0);
    uVar3 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_2400._4_4_ = uVar3;
    local_2400._0_4_ = uVar3;
    local_2400._8_4_ = uVar3;
    local_2400._12_4_ = uVar3;
    local_2400._16_4_ = uVar3;
    local_2400._20_4_ = uVar3;
    local_2400._24_4_ = uVar3;
    local_2400._28_4_ = uVar3;
    auVar186 = ZEXT3264(local_2400);
    uVar3 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_2420._4_4_ = uVar3;
    local_2420._0_4_ = uVar3;
    local_2420._8_4_ = uVar3;
    local_2420._12_4_ = uVar3;
    local_2420._16_4_ = uVar3;
    local_2420._20_4_ = uVar3;
    local_2420._24_4_ = uVar3;
    local_2420._28_4_ = uVar3;
    auVar194 = ZEXT3264(local_2420);
    auVar162 = vshufps_avx(auVar161,auVar161,0);
    local_2440._16_16_ = auVar162;
    local_2440._0_16_ = auVar162;
    auVar202 = ZEXT3264(local_2440);
    auVar162 = vmovshdup_avx(auVar161);
    auVar172 = vshufps_avx(auVar161,auVar161,0x55);
    local_2460._16_16_ = auVar172;
    local_2460._0_16_ = auVar172;
    auVar203 = ZEXT3264(local_2460);
    auVar172 = vshufpd_avx(auVar161,auVar161,1);
    auVar177 = ZEXT1664(auVar172);
    auVar160 = vshufps_avx(auVar161,auVar161,0xaa);
    local_2480._16_16_ = auVar160;
    local_2480._0_16_ = auVar160;
    auVar207 = ZEXT3264(local_2480);
    uVar117 = (ulong)(auVar161._0_4_ < 0.0) << 5;
    uVar127 = (ulong)(auVar162._0_4_ < 0.0) << 5 | 0x40;
    uVar130 = (ulong)(auVar172._0_4_ < 0.0) << 5 | 0x80;
    uVar129 = uVar117 ^ 0x20;
    auVar162 = vshufps_avx(auVar136,auVar136,0);
    local_24a0._16_16_ = auVar162;
    local_24a0._0_16_ = auVar162;
    auVar215 = ZEXT3264(local_24a0);
    auVar162 = vshufps_avx(auVar148,auVar148,0);
    auVar135 = ZEXT3264(CONCAT1616(auVar162,auVar162));
    local_26a0._16_16_ = mm_lookupmask_ps._240_16_;
    local_26a0._0_16_ = mm_lookupmask_ps._240_16_;
    local_24c0 = vperm2f128_avx(local_26a0,mm_lookupmask_ps._0_32_,2);
    auVar166 = ZEXT3264(local_24c0);
    auVar150._8_4_ = 0xbf800000;
    auVar150._0_8_ = 0xbf800000bf800000;
    auVar150._12_4_ = 0xbf800000;
    auVar150._16_4_ = 0xbf800000;
    auVar150._20_4_ = 0xbf800000;
    auVar150._24_4_ = 0xbf800000;
    auVar150._28_4_ = 0xbf800000;
    auVar167._8_4_ = 0x3f800000;
    auVar167._0_8_ = 0x3f8000003f800000;
    auVar167._12_4_ = 0x3f800000;
    auVar167._16_4_ = 0x3f800000;
    auVar167._20_4_ = 0x3f800000;
    auVar167._24_4_ = 0x3f800000;
    auVar167._28_4_ = 0x3f800000;
    auVar171 = ZEXT3264(auVar167);
    _local_24e0 = vblendvps_avx(auVar167,auVar150,local_24c0);
    local_28e8 = context;
    local_2880 = uVar117;
LAB_00e6cc66:
    if (local_2918 != (undefined1 (*) [16])&local_23a0) {
      pauVar115 = local_2918 + -1;
      local_2918 = local_2918 + -1;
      if (*(float *)(*pauVar115 + 8) <= auVar144._0_4_) {
        uVar124 = *(ulong *)*local_2918;
        while ((uVar124 & 8) == 0) {
          uVar110 = uVar124 & 0xfffffffffffffff0;
          fVar147 = (ray->super_RayK<1>).dir.field_0.m128[3];
          auVar151._4_4_ = fVar147;
          auVar151._0_4_ = fVar147;
          auVar151._8_4_ = fVar147;
          auVar151._12_4_ = fVar147;
          auVar151._16_4_ = fVar147;
          auVar151._20_4_ = fVar147;
          auVar151._24_4_ = fVar147;
          auVar151._28_4_ = fVar147;
          pfVar2 = (float *)(uVar110 + 0x100 + uVar117);
          pfVar1 = (float *)(uVar110 + 0x40 + uVar117);
          auVar138._0_4_ = fVar147 * *pfVar2 + *pfVar1;
          auVar138._4_4_ = fVar147 * pfVar2[1] + pfVar1[1];
          auVar138._8_4_ = fVar147 * pfVar2[2] + pfVar1[2];
          auVar138._12_4_ = fVar147 * pfVar2[3] + pfVar1[3];
          auVar138._16_4_ = fVar147 * pfVar2[4] + pfVar1[4];
          auVar138._20_4_ = fVar147 * pfVar2[5] + pfVar1[5];
          auVar138._24_4_ = fVar147 * pfVar2[6] + pfVar1[6];
          auVar138._28_4_ = auVar144._28_4_ + pfVar1[7];
          auVar150 = vsubps_avx(auVar138,auVar181._0_32_);
          auVar75._4_4_ = auVar202._4_4_ * auVar150._4_4_;
          auVar75._0_4_ = auVar202._0_4_ * auVar150._0_4_;
          auVar75._8_4_ = auVar202._8_4_ * auVar150._8_4_;
          auVar75._12_4_ = auVar202._12_4_ * auVar150._12_4_;
          auVar75._16_4_ = auVar202._16_4_ * auVar150._16_4_;
          auVar75._20_4_ = auVar202._20_4_ * auVar150._20_4_;
          auVar75._24_4_ = auVar202._24_4_ * auVar150._24_4_;
          auVar75._28_4_ = auVar150._28_4_;
          auVar150 = vmaxps_avx(auVar215._0_32_,auVar75);
          pfVar2 = (float *)(uVar110 + 0x100 + uVar127);
          pfVar1 = (float *)(uVar110 + 0x40 + uVar127);
          auVar164._0_4_ = fVar147 * *pfVar2 + *pfVar1;
          auVar164._4_4_ = fVar147 * pfVar2[1] + pfVar1[1];
          auVar164._8_4_ = fVar147 * pfVar2[2] + pfVar1[2];
          auVar164._12_4_ = fVar147 * pfVar2[3] + pfVar1[3];
          auVar164._16_4_ = fVar147 * pfVar2[4] + pfVar1[4];
          auVar164._20_4_ = fVar147 * pfVar2[5] + pfVar1[5];
          auVar164._24_4_ = fVar147 * pfVar2[6] + pfVar1[6];
          auVar164._28_4_ = auVar166._28_4_ + pfVar1[7];
          auVar167 = vsubps_avx(auVar164,auVar186._0_32_);
          auVar76._4_4_ = auVar203._4_4_ * auVar167._4_4_;
          auVar76._0_4_ = auVar203._0_4_ * auVar167._0_4_;
          auVar76._8_4_ = auVar203._8_4_ * auVar167._8_4_;
          auVar76._12_4_ = auVar203._12_4_ * auVar167._12_4_;
          auVar76._16_4_ = auVar203._16_4_ * auVar167._16_4_;
          auVar76._20_4_ = auVar203._20_4_ * auVar167._20_4_;
          auVar76._24_4_ = auVar203._24_4_ * auVar167._24_4_;
          auVar76._28_4_ = auVar167._28_4_;
          pfVar2 = (float *)(uVar110 + 0x100 + uVar130);
          pfVar1 = (float *)(uVar110 + 0x40 + uVar130);
          auVar168._0_4_ = fVar147 * *pfVar2 + *pfVar1;
          auVar168._4_4_ = fVar147 * pfVar2[1] + pfVar1[1];
          auVar168._8_4_ = fVar147 * pfVar2[2] + pfVar1[2];
          auVar168._12_4_ = fVar147 * pfVar2[3] + pfVar1[3];
          auVar168._16_4_ = fVar147 * pfVar2[4] + pfVar1[4];
          auVar168._20_4_ = fVar147 * pfVar2[5] + pfVar1[5];
          auVar168._24_4_ = fVar147 * pfVar2[6] + pfVar1[6];
          auVar168._28_4_ = auVar171._28_4_ + pfVar1[7];
          auVar75 = vsubps_avx(auVar168,auVar194._0_32_);
          auVar77._4_4_ = auVar207._4_4_ * auVar75._4_4_;
          auVar77._0_4_ = auVar207._0_4_ * auVar75._0_4_;
          auVar77._8_4_ = auVar207._8_4_ * auVar75._8_4_;
          auVar77._12_4_ = auVar207._12_4_ * auVar75._12_4_;
          auVar77._16_4_ = auVar207._16_4_ * auVar75._16_4_;
          auVar77._20_4_ = auVar207._20_4_ * auVar75._20_4_;
          auVar77._24_4_ = auVar207._24_4_ * auVar75._24_4_;
          auVar77._28_4_ = auVar75._28_4_;
          auVar167 = vmaxps_avx(auVar76,auVar77);
          local_2660 = vmaxps_avx(auVar150,auVar167);
          pfVar2 = (float *)(uVar110 + 0x100 + uVar129);
          pfVar1 = (float *)(uVar110 + 0x40 + uVar129);
          auVar165._0_4_ = fVar147 * *pfVar2 + *pfVar1;
          auVar165._4_4_ = fVar147 * pfVar2[1] + pfVar1[1];
          auVar165._8_4_ = fVar147 * pfVar2[2] + pfVar1[2];
          auVar165._12_4_ = fVar147 * pfVar2[3] + pfVar1[3];
          auVar165._16_4_ = fVar147 * pfVar2[4] + pfVar1[4];
          auVar165._20_4_ = fVar147 * pfVar2[5] + pfVar1[5];
          auVar165._24_4_ = fVar147 * pfVar2[6] + pfVar1[6];
          auVar165._28_4_ = auVar167._28_4_ + pfVar1[7];
          auVar150 = vsubps_avx(auVar165,auVar181._0_32_);
          auVar78._4_4_ = auVar202._4_4_ * auVar150._4_4_;
          auVar78._0_4_ = auVar202._0_4_ * auVar150._0_4_;
          auVar78._8_4_ = auVar202._8_4_ * auVar150._8_4_;
          auVar78._12_4_ = auVar202._12_4_ * auVar150._12_4_;
          auVar78._16_4_ = auVar202._16_4_ * auVar150._16_4_;
          auVar78._20_4_ = auVar202._20_4_ * auVar150._20_4_;
          auVar78._24_4_ = auVar202._24_4_ * auVar150._24_4_;
          auVar78._28_4_ = auVar150._28_4_;
          pfVar2 = (float *)(uVar110 + 0x100 + (uVar127 ^ 0x20));
          auVar150 = vminps_avx(auVar135._0_32_,auVar78);
          pfVar1 = (float *)(uVar110 + 0x40 + (uVar127 ^ 0x20));
          auVar169._0_4_ = fVar147 * *pfVar2 + *pfVar1;
          auVar169._4_4_ = fVar147 * pfVar2[1] + pfVar1[1];
          auVar169._8_4_ = fVar147 * pfVar2[2] + pfVar1[2];
          auVar169._12_4_ = fVar147 * pfVar2[3] + pfVar1[3];
          auVar169._16_4_ = fVar147 * pfVar2[4] + pfVar1[4];
          auVar169._20_4_ = fVar147 * pfVar2[5] + pfVar1[5];
          auVar169._24_4_ = fVar147 * pfVar2[6] + pfVar1[6];
          auVar169._28_4_ = auVar75._28_4_ + pfVar1[7];
          auVar167 = vsubps_avx(auVar169,auVar186._0_32_);
          pfVar2 = (float *)(uVar110 + 0x100 + (uVar130 ^ 0x20));
          pfVar1 = (float *)(uVar110 + 0x40 + (uVar130 ^ 0x20));
          auVar175._0_4_ = fVar147 * *pfVar2 + *pfVar1;
          auVar175._4_4_ = fVar147 * pfVar2[1] + pfVar1[1];
          auVar175._8_4_ = fVar147 * pfVar2[2] + pfVar1[2];
          auVar175._12_4_ = fVar147 * pfVar2[3] + pfVar1[3];
          auVar175._16_4_ = fVar147 * pfVar2[4] + pfVar1[4];
          auVar175._20_4_ = fVar147 * pfVar2[5] + pfVar1[5];
          auVar175._24_4_ = fVar147 * pfVar2[6] + pfVar1[6];
          auVar175._28_4_ = auVar177._28_4_ + pfVar1[7];
          auVar79._4_4_ = auVar203._4_4_ * auVar167._4_4_;
          auVar79._0_4_ = auVar203._0_4_ * auVar167._0_4_;
          auVar79._8_4_ = auVar203._8_4_ * auVar167._8_4_;
          auVar79._12_4_ = auVar203._12_4_ * auVar167._12_4_;
          auVar79._16_4_ = auVar203._16_4_ * auVar167._16_4_;
          auVar79._20_4_ = auVar203._20_4_ * auVar167._20_4_;
          auVar79._24_4_ = auVar203._24_4_ * auVar167._24_4_;
          auVar79._28_4_ = auVar167._28_4_;
          auVar167 = vsubps_avx(auVar175,auVar194._0_32_);
          auVar83._4_4_ = auVar207._4_4_ * auVar167._4_4_;
          auVar83._0_4_ = auVar207._0_4_ * auVar167._0_4_;
          auVar83._8_4_ = auVar207._8_4_ * auVar167._8_4_;
          auVar83._12_4_ = auVar207._12_4_ * auVar167._12_4_;
          auVar83._16_4_ = auVar207._16_4_ * auVar167._16_4_;
          auVar83._20_4_ = auVar207._20_4_ * auVar167._20_4_;
          auVar83._24_4_ = auVar207._24_4_ * auVar167._24_4_;
          auVar83._28_4_ = auVar167._28_4_;
          auVar177 = ZEXT3264(auVar83);
          auVar167 = vminps_avx(auVar79,auVar83);
          auVar150 = vminps_avx(auVar150,auVar167);
          auVar150 = vcmpps_avx(local_2660,auVar150,2);
          if (((uint)uVar124 & 7) == 6) {
            auVar167 = vcmpps_avx(*(undefined1 (*) [32])(uVar110 + 0x1c0),auVar151,2);
            auVar75 = vcmpps_avx(auVar151,*(undefined1 (*) [32])(uVar110 + 0x1e0),1);
            auVar75 = vandps_avx(auVar167,auVar75);
            auVar150 = vandps_avx(auVar75,auVar150);
            auVar162 = vpackssdw_avx(auVar150._0_16_,auVar150._16_16_);
          }
          else {
            auVar162 = vpackssdw_avx(auVar150._0_16_,auVar150._16_16_);
          }
          auVar171 = ZEXT3264(auVar167);
          auVar162 = vpsllw_avx(auVar162,0xf);
          auVar166 = ZEXT1664(auVar162);
          if ((((((((auVar162 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar162 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar162 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar162 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar162 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar162 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar162 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar162[0xf]) {
            auVar162 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])
                                              ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc),0));
            auVar144 = ZEXT1664(auVar162);
            goto LAB_00e6cc66;
          }
          auVar162 = vpacksswb_avx(auVar162,auVar162);
          auVar144 = ZEXT1664(auVar162);
          bVar82 = SUB161(auVar162 >> 7,0) & 1 | (SUB161(auVar162 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar162 >> 0x17,0) & 1) << 2 | (SUB161(auVar162 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar162 >> 0x27,0) & 1) << 4 | (SUB161(auVar162 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar162 >> 0x37,0) & 1) << 6 | SUB161(auVar162 >> 0x3f,0) << 7;
          lVar111 = 0;
          if (bVar82 != 0) {
            for (; (bVar82 >> lVar111 & 1) == 0; lVar111 = lVar111 + 1) {
            }
          }
          uVar124 = *(ulong *)(uVar110 + lVar111 * 8);
          uVar122 = bVar82 - 1 & (uint)bVar82;
          if (uVar122 != 0) {
            uVar195 = *(uint *)(local_2660 + lVar111 * 4);
            lVar111 = 0;
            if (uVar122 != 0) {
              for (; (uVar122 >> lVar111 & 1) == 0; lVar111 = lVar111 + 1) {
              }
            }
            uVar118 = *(ulong *)(uVar110 + lVar111 * 8);
            uVar114 = *(uint *)(local_2660 + lVar111 * 4);
            uVar122 = uVar122 - 1 & uVar122;
            if (uVar122 == 0) {
              if (uVar195 < uVar114) {
                *(ulong *)*local_2918 = uVar118;
                *(uint *)(*local_2918 + 8) = uVar114;
                local_2918 = local_2918 + 1;
              }
              else {
                *(ulong *)*local_2918 = uVar124;
                *(uint *)(*local_2918 + 8) = uVar195;
                local_2918 = local_2918 + 1;
                uVar124 = uVar118;
              }
            }
            else {
              auVar136._8_8_ = 0;
              auVar136._0_8_ = uVar124;
              auVar162 = vpunpcklqdq_avx(auVar136,ZEXT416(uVar195));
              auVar148._8_8_ = 0;
              auVar148._0_8_ = uVar118;
              auVar136 = vpunpcklqdq_avx(auVar148,ZEXT416(uVar114));
              lVar111 = 0;
              if (uVar122 != 0) {
                for (; (uVar122 >> lVar111 & 1) == 0; lVar111 = lVar111 + 1) {
                }
              }
              auVar163._8_8_ = 0;
              auVar163._0_8_ = *(ulong *)(uVar110 + lVar111 * 8);
              auVar172 = vpunpcklqdq_avx(auVar163,ZEXT416(*(uint *)(local_2660 + lVar111 * 4)));
              auVar166 = ZEXT1664(auVar172);
              auVar148 = vpcmpgtd_avx(auVar136,auVar162);
              auVar171 = ZEXT1664(auVar148);
              uVar122 = uVar122 - 1 & uVar122;
              if (uVar122 == 0) {
                auVar160 = vpshufd_avx(auVar148,0xaa);
                auVar148 = vblendvps_avx(auVar136,auVar162,auVar160);
                auVar162 = vblendvps_avx(auVar162,auVar136,auVar160);
                auVar136 = vpcmpgtd_avx(auVar172,auVar148);
                auVar160 = vpshufd_avx(auVar136,0xaa);
                auVar136 = vblendvps_avx(auVar172,auVar148,auVar160);
                auVar171 = ZEXT1664(auVar136);
                auVar148 = vblendvps_avx(auVar148,auVar172,auVar160);
                auVar172 = vpcmpgtd_avx(auVar148,auVar162);
                auVar160 = vpshufd_avx(auVar172,0xaa);
                auVar166 = ZEXT1664(auVar160);
                auVar172 = vblendvps_avx(auVar148,auVar162,auVar160);
                auVar177 = ZEXT1664(auVar172);
                auVar162 = vblendvps_avx(auVar162,auVar148,auVar160);
                auVar144 = ZEXT1664(auVar162);
                *local_2918 = auVar162;
                local_2918[1] = auVar172;
                uVar124 = auVar136._0_8_;
                local_2918 = local_2918 + 2;
              }
              else {
                lVar111 = 0;
                if (uVar122 != 0) {
                  for (; (uVar122 >> lVar111 & 1) == 0; lVar111 = lVar111 + 1) {
                  }
                }
                auVar174._8_8_ = 0;
                auVar174._0_8_ = *(ulong *)(uVar110 + lVar111 * 8);
                auVar160 = vpunpcklqdq_avx(auVar174,ZEXT416(*(uint *)(local_2660 + lVar111 * 4)));
                auVar177 = ZEXT1664(auVar160);
                uVar122 = uVar122 - 1 & uVar122;
                uVar124 = (ulong)uVar122;
                if (uVar122 == 0) {
                  auVar161 = vpshufd_avx(auVar148,0xaa);
                  auVar148 = vblendvps_avx(auVar136,auVar162,auVar161);
                  auVar162 = vblendvps_avx(auVar162,auVar136,auVar161);
                  auVar136 = vpcmpgtd_avx(auVar160,auVar172);
                  auVar161 = vpshufd_avx(auVar136,0xaa);
                  auVar136 = vblendvps_avx(auVar160,auVar172,auVar161);
                  auVar172 = vblendvps_avx(auVar172,auVar160,auVar161);
                  auVar160 = vpcmpgtd_avx(auVar172,auVar162);
                  auVar161 = vpshufd_avx(auVar160,0xaa);
                  auVar160 = vblendvps_avx(auVar172,auVar162,auVar161);
                  auVar177 = ZEXT1664(auVar160);
                  auVar162 = vblendvps_avx(auVar162,auVar172,auVar161);
                  auVar144 = ZEXT1664(auVar162);
                  auVar172 = vpcmpgtd_avx(auVar136,auVar148);
                  auVar161 = vpshufd_avx(auVar172,0xaa);
                  auVar172 = vblendvps_avx(auVar136,auVar148,auVar161);
                  auVar166 = ZEXT1664(auVar172);
                  auVar136 = vblendvps_avx(auVar148,auVar136,auVar161);
                  auVar148 = vpcmpgtd_avx(auVar160,auVar136);
                  auVar161 = vpshufd_avx(auVar148,0xaa);
                  auVar171 = ZEXT1664(auVar161);
                  auVar148 = vblendvps_avx(auVar160,auVar136,auVar161);
                  auVar136 = vblendvps_avx(auVar136,auVar160,auVar161);
                  *local_2918 = auVar162;
                  local_2918[1] = auVar136;
                  local_2918[2] = auVar148;
                  uVar124 = auVar172._0_8_;
                  local_2918 = local_2918 + 3;
                }
                else {
                  *local_2918 = auVar162;
                  local_2918[1] = auVar136;
                  local_2918[2] = auVar172;
                  pauVar115 = local_2918 + 3;
                  local_2918[3] = auVar160;
                  do {
                    lVar111 = 0;
                    if (uVar124 != 0) {
                      for (; (uVar124 >> lVar111 & 1) == 0; lVar111 = lVar111 + 1) {
                      }
                    }
                    auVar137._8_8_ = 0;
                    auVar137._0_8_ = *(ulong *)(uVar110 + lVar111 * 8);
                    auVar162 = vpunpcklqdq_avx(auVar137,ZEXT416(*(uint *)(local_2660 + lVar111 * 4))
                                              );
                    pauVar115[1] = auVar162;
                    pauVar115 = pauVar115 + 1;
                    uVar124 = uVar124 & uVar124 - 1;
                  } while (uVar124 != 0);
                  lVar111 = 0;
                  while (auVar144 = ZEXT1664(auVar162), pauVar115 != local_2918) {
                    auVar162 = local_2918[1];
                    uVar122 = vextractps_avx(auVar162,2);
                    for (lVar121 = 0x10;
                        (lVar111 != lVar121 && (*(uint *)(local_2918[-1] + lVar121 + 8) < uVar122));
                        lVar121 = lVar121 + -0x10) {
                      *(undefined1 (*) [16])(*local_2918 + lVar121) =
                           *(undefined1 (*) [16])(local_2918[-1] + lVar121);
                    }
                    *(undefined1 (*) [16])(*local_2918 + lVar121) = auVar162;
                    lVar111 = lVar111 + -0x10;
                    local_2918 = local_2918 + 1;
                  }
                  uVar124 = *(ulong *)*pauVar115;
                  local_2918 = pauVar115;
                }
              }
            }
          }
        }
        local_2878 = (ulong)((uint)uVar124 & 0xf) - 8;
        uVar124 = uVar124 & 0xfffffffffffffff0;
        for (lVar111 = 0; lVar111 != local_2878; lVar111 = lVar111 + 1) {
          lVar112 = lVar111 * 0x60;
          pSVar6 = context->scene;
          pRVar7 = (pSVar6->geometries).items;
          pGVar8 = pRVar7[*(uint *)(uVar124 + 0x40 + lVar112)].ptr;
          fVar147 = (pGVar8->time_range).lower;
          fVar147 = pGVar8->fnumTimeSegments *
                    (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar147) /
                    ((pGVar8->time_range).upper - fVar147));
          auVar162 = vroundss_avx(ZEXT416((uint)fVar147),ZEXT416((uint)fVar147),9);
          auVar162 = vminss_avx(auVar162,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
          auVar205 = vmaxss_avx(ZEXT816(0) << 0x20,auVar162);
          iVar113 = (int)auVar205._0_4_;
          lVar125 = (long)iVar113 * 0x38;
          lVar121 = *(long *)(*(long *)&pGVar8[2].numPrimitives + lVar125);
          local_2848 = (ulong)*(uint *)(uVar124 + 4 + lVar112);
          auVar162 = *(undefined1 (*) [16])(lVar121 + (ulong)*(uint *)(uVar124 + lVar112) * 4);
          uVar117 = (ulong)*(uint *)(uVar124 + 0x10 + lVar112);
          auVar136 = *(undefined1 (*) [16])(lVar121 + uVar117 * 4);
          uVar110 = (ulong)*(uint *)(uVar124 + 0x20 + lVar112);
          auVar148 = *(undefined1 (*) [16])(lVar121 + uVar110 * 4);
          uVar118 = (ulong)*(uint *)(uVar124 + 0x30 + lVar112);
          auVar172 = *(undefined1 (*) [16])(lVar121 + uVar118 * 4);
          local_2858 = *(long *)&pRVar7[*(uint *)(uVar124 + 0x44 + lVar112)].ptr[2].numPrimitives;
          lVar121 = *(long *)(local_2858 + lVar125);
          auVar160 = *(undefined1 (*) [16])(lVar121 + local_2848 * 4);
          local_2838 = (ulong)*(uint *)(uVar124 + 0x14 + lVar112);
          auVar161 = *(undefined1 (*) [16])(lVar121 + local_2838 * 4);
          uVar119 = (ulong)*(uint *)(uVar124 + 0x24 + lVar112);
          auVar173 = *(undefined1 (*) [16])(lVar121 + uVar119 * 4);
          uVar120 = (ulong)*(uint *)(uVar124 + 0x34 + lVar112);
          auVar163 = *(undefined1 (*) [16])(lVar121 + uVar120 * 4);
          lVar121 = *(long *)&pRVar7[*(uint *)(uVar124 + 0x48 + lVar112)].ptr[2].numPrimitives;
          lVar9 = *(long *)(lVar121 + lVar125);
          uVar123 = (ulong)*(uint *)(uVar124 + 8 + lVar112);
          auVar174 = *(undefined1 (*) [16])(lVar9 + uVar123 * 4);
          local_2860 = (ulong)*(uint *)(uVar124 + 0x18 + lVar112);
          auVar137 = *(undefined1 (*) [16])(lVar9 + local_2860 * 4);
          local_2850 = (ulong)*(uint *)(uVar124 + 0x28 + lVar112);
          auVar131 = *(undefined1 (*) [16])(lVar9 + local_2850 * 4);
          local_2840 = (ulong)*(uint *)(uVar124 + 0x38 + lVar112);
          auVar149 = *(undefined1 (*) [16])(lVar9 + local_2840 * 4);
          fVar147 = fVar147 - auVar205._0_4_;
          local_26b0 = ZEXT416((uint)fVar147);
          lVar9 = *(long *)&pRVar7[*(uint *)(uVar124 + 0x4c + lVar112)].ptr[2].numPrimitives;
          lVar125 = *(long *)(lVar9 + lVar125);
          uVar126 = (ulong)*(uint *)(uVar124 + 0xc + lVar112);
          auVar205 = *(undefined1 (*) [16])(lVar125 + uVar126 * 4);
          local_2870 = (ulong)*(uint *)(uVar124 + 0x1c + lVar112);
          auVar218 = *(undefined1 (*) [16])(lVar125 + local_2870 * 4);
          auVar183 = vunpcklps_avx(auVar162,auVar174);
          auVar174 = vunpckhps_avx(auVar162,auVar174);
          auVar80 = vunpcklps_avx(auVar160,auVar205);
          auVar160 = vunpckhps_avx(auVar160,auVar205);
          uVar128 = (ulong)*(uint *)(uVar124 + 0x2c + lVar112);
          auVar162 = *(undefined1 (*) [16])(lVar125 + uVar128 * 4);
          _local_26d0 = vunpcklps_avx(auVar174,auVar160);
          auVar108 = _local_26d0;
          _local_2710 = vunpcklps_avx(auVar183,auVar80);
          auVar104 = _local_2710;
          _local_26f0 = vunpckhps_avx(auVar183,auVar80);
          auVar106 = _local_26f0;
          auVar174 = vunpcklps_avx(auVar136,auVar137);
          auVar160 = vunpckhps_avx(auVar136,auVar137);
          auVar137 = vunpcklps_avx(auVar161,auVar218);
          auVar161 = vunpckhps_avx(auVar161,auVar218);
          local_2868 = (ulong)*(uint *)(uVar124 + 0x3c + lVar112);
          auVar136 = *(undefined1 (*) [16])(lVar125 + local_2868 * 4);
          _local_26c0 = vunpcklps_avx(auVar160,auVar161);
          auVar109 = _local_26c0;
          _local_2700 = vunpcklps_avx(auVar174,auVar137);
          auVar105 = _local_2700;
          _local_26e0 = vunpckhps_avx(auVar174,auVar137);
          auVar107 = _local_26e0;
          auVar161 = vunpcklps_avx(auVar148,auVar131);
          auVar148 = vunpckhps_avx(auVar148,auVar131);
          auVar174 = vunpcklps_avx(auVar173,auVar162);
          auVar160 = vunpckhps_avx(auVar173,auVar162);
          lVar116 = (long)(iVar113 + 1) * 0x38;
          lVar125 = *(long *)(*(long *)&pGVar8[2].numPrimitives + lVar116);
          auVar162 = *(undefined1 (*) [16])(lVar125 + (ulong)*(uint *)(uVar124 + lVar112) * 4);
          _local_2890 = vunpcklps_avx(auVar148,auVar160);
          auVar100 = _local_2890;
          _local_2740 = vunpcklps_avx(auVar161,auVar174);
          auVar101 = _local_2740;
          _local_2720 = vunpckhps_avx(auVar161,auVar174);
          auVar103 = _local_2720;
          auVar160 = vunpcklps_avx(auVar172,auVar149);
          auVar148 = vunpckhps_avx(auVar172,auVar149);
          auVar161 = vunpcklps_avx(auVar163,auVar136);
          auVar172 = vunpckhps_avx(auVar163,auVar136);
          lVar121 = *(long *)(lVar121 + lVar116);
          auVar136 = *(undefined1 (*) [16])(lVar121 + uVar123 * 4);
          _local_28a0 = vunpcklps_avx(auVar148,auVar172);
          auVar99 = _local_28a0;
          auVar173 = vunpcklps_avx(auVar160,auVar161);
          _local_2730 = vunpckhps_avx(auVar160,auVar161);
          auVar102 = _local_2730;
          lVar10 = *(long *)(local_2858 + lVar116);
          auVar172 = vunpcklps_avx(auVar162,auVar136);
          auVar148 = vunpckhps_avx(auVar162,auVar136);
          auVar162 = *(undefined1 (*) [16])(lVar10 + local_2848 * 4);
          lVar9 = *(long *)(lVar9 + lVar116);
          auVar136 = *(undefined1 (*) [16])(lVar9 + uVar126 * 4);
          auVar160 = vunpcklps_avx(auVar162,auVar136);
          auVar162 = vunpckhps_avx(auVar162,auVar136);
          auVar163 = vunpcklps_avx(auVar148,auVar162);
          auVar174 = vunpcklps_avx(auVar172,auVar160);
          auVar148 = vunpckhps_avx(auVar172,auVar160);
          auVar162 = *(undefined1 (*) [16])(lVar125 + uVar117 * 4);
          auVar136 = *(undefined1 (*) [16])(lVar121 + local_2860 * 4);
          auVar160 = vunpcklps_avx(auVar162,auVar136);
          auVar172 = vunpckhps_avx(auVar162,auVar136);
          auVar162 = *(undefined1 (*) [16])(lVar10 + local_2838 * 4);
          auVar136 = *(undefined1 (*) [16])(lVar9 + local_2870 * 4);
          auVar161 = vunpcklps_avx(auVar162,auVar136);
          auVar162 = vunpckhps_avx(auVar162,auVar136);
          auVar137 = vunpcklps_avx(auVar172,auVar162);
          auVar131 = vunpcklps_avx(auVar160,auVar161);
          auVar172 = vunpckhps_avx(auVar160,auVar161);
          auVar162 = *(undefined1 (*) [16])(lVar125 + uVar110 * 4);
          auVar136 = *(undefined1 (*) [16])(lVar121 + local_2850 * 4);
          auVar161 = vunpcklps_avx(auVar162,auVar136);
          auVar160 = vunpckhps_avx(auVar162,auVar136);
          auVar162 = *(undefined1 (*) [16])(lVar10 + uVar119 * 4);
          auVar136 = *(undefined1 (*) [16])(lVar9 + uVar128 * 4);
          auVar149 = vunpcklps_avx(auVar162,auVar136);
          auVar162 = vunpckhps_avx(auVar162,auVar136);
          auVar205 = vunpcklps_avx(auVar160,auVar162);
          auVar218 = vunpcklps_avx(auVar161,auVar149);
          auVar160 = vunpckhps_avx(auVar161,auVar149);
          auVar162 = *(undefined1 (*) [16])(lVar125 + uVar118 * 4);
          auVar136 = *(undefined1 (*) [16])(lVar121 + local_2840 * 4);
          auVar149 = vunpcklps_avx(auVar162,auVar136);
          auVar161 = vunpckhps_avx(auVar162,auVar136);
          auVar162 = *(undefined1 (*) [16])(lVar10 + uVar120 * 4);
          auVar136 = *(undefined1 (*) [16])(lVar9 + local_2868 * 4);
          auVar183 = vunpcklps_avx(auVar162,auVar136);
          auVar162 = vunpckhps_avx(auVar162,auVar136);
          auVar80 = vunpcklps_avx(auVar161,auVar162);
          auVar81 = vunpcklps_avx(auVar149,auVar183);
          auVar161 = vunpckhps_avx(auVar149,auVar183);
          auVar162 = vshufps_avx(local_26b0,local_26b0,0);
          auVar136 = ZEXT416((uint)(1.0 - fVar147));
          auVar136 = vshufps_avx(auVar136,auVar136,0);
          fVar147 = auVar162._0_4_;
          fVar155 = auVar162._4_4_;
          fVar156 = auVar162._8_4_;
          fVar157 = auVar162._12_4_;
          fVar158 = auVar136._0_4_;
          fVar159 = auVar136._4_4_;
          fVar145 = auVar136._8_4_;
          fVar146 = auVar136._12_4_;
          auVar170._4_4_ = fVar159 * (float)local_2710._4_4_ + auVar174._4_4_ * fVar155;
          auVar170._0_4_ = fVar158 * (float)local_2710._0_4_ + auVar174._0_4_ * fVar147;
          auVar170._8_4_ = fVar145 * fStack_2708 + auVar174._8_4_ * fVar156;
          auVar170._12_4_ = fVar146 * fStack_2704 + auVar174._12_4_ * fVar157;
          auVar176._4_4_ = fVar159 * (float)local_26f0._4_4_ + auVar148._4_4_ * fVar155;
          auVar176._0_4_ = fVar158 * (float)local_26f0._0_4_ + auVar148._0_4_ * fVar147;
          auVar176._8_4_ = fVar145 * fStack_26e8 + auVar148._8_4_ * fVar156;
          auVar176._12_4_ = fVar146 * fStack_26e4 + auVar148._12_4_ * fVar157;
          auVar180._4_4_ = fVar159 * (float)local_26d0._4_4_ + auVar163._4_4_ * fVar155;
          auVar180._0_4_ = fVar158 * (float)local_26d0._0_4_ + auVar163._0_4_ * fVar147;
          auVar180._8_4_ = fVar145 * fStack_26c8 + auVar163._8_4_ * fVar156;
          auVar180._12_4_ = fVar146 * fStack_26c4 + auVar163._12_4_ * fVar157;
          auVar183._0_4_ = fVar158 * (float)local_2700._0_4_ + fVar147 * auVar131._0_4_;
          auVar183._4_4_ = fVar159 * (float)local_2700._4_4_ + fVar155 * auVar131._4_4_;
          auVar183._8_4_ = fVar145 * fStack_26f8 + fVar156 * auVar131._8_4_;
          auVar183._12_4_ = fVar146 * fStack_26f4 + fVar157 * auVar131._12_4_;
          auVar149._0_4_ = fVar158 * (float)local_26e0._0_4_ + fVar147 * auVar172._0_4_;
          auVar149._4_4_ = fVar159 * (float)local_26e0._4_4_ + fVar155 * auVar172._4_4_;
          auVar149._8_4_ = fVar145 * fStack_26d8 + fVar156 * auVar172._8_4_;
          auVar149._12_4_ = fVar146 * fStack_26d4 + fVar157 * auVar172._12_4_;
          auVar216._0_4_ = fVar158 * (float)local_26c0._0_4_ + auVar137._0_4_ * fVar147;
          auVar216._4_4_ = fVar159 * (float)local_26c0._4_4_ + auVar137._4_4_ * fVar155;
          auVar216._8_4_ = fVar145 * fStack_26b8 + auVar137._8_4_ * fVar156;
          auVar216._12_4_ = fVar146 * fStack_26b4 + auVar137._12_4_ * fVar157;
          auVar170._20_4_ = fVar159 * (float)local_2740._4_4_ + fVar155 * auVar218._4_4_;
          auVar170._16_4_ = fVar158 * (float)local_2740._0_4_ + fVar147 * auVar218._0_4_;
          auVar170._24_4_ = fVar145 * fStack_2738 + fVar156 * auVar218._8_4_;
          auVar170._28_4_ = fVar146 * fStack_2734 + fVar157 * auVar218._12_4_;
          auVar176._20_4_ = fVar159 * (float)local_2720._4_4_ + auVar160._4_4_ * fVar155;
          auVar176._16_4_ = fVar158 * (float)local_2720._0_4_ + auVar160._0_4_ * fVar147;
          auVar176._24_4_ = fVar145 * fStack_2718 + auVar160._8_4_ * fVar156;
          auVar176._28_4_ = fVar146 * fStack_2714 + auVar160._12_4_ * fVar157;
          auVar180._20_4_ = fVar159 * (float)local_2890._4_4_ + auVar205._4_4_ * fVar155;
          auVar180._16_4_ = fVar158 * (float)local_2890._0_4_ + auVar205._0_4_ * fVar147;
          auVar180._24_4_ = fVar145 * fStack_2888 + auVar205._8_4_ * fVar156;
          auVar180._28_4_ = fVar146 * fStack_2884 + auVar205._12_4_ * fVar157;
          auVar218._0_4_ = auVar173._0_4_ * fVar158 + fVar147 * auVar81._0_4_;
          auVar218._4_4_ = auVar173._4_4_ * fVar159 + fVar155 * auVar81._4_4_;
          auVar218._8_4_ = auVar173._8_4_ * fVar145 + fVar156 * auVar81._8_4_;
          auVar218._12_4_ = auVar173._12_4_ * fVar146 + fVar157 * auVar81._12_4_;
          lVar121 = uVar124 + 0x40 + lVar112;
          local_23c0 = *(undefined8 *)(lVar121 + 0x10);
          uStack_23b8 = *(undefined8 *)(lVar121 + 0x18);
          uStack_23b0 = local_23c0;
          uStack_23a8 = uStack_23b8;
          lVar112 = uVar124 + 0x50 + lVar112;
          local_2680 = *(undefined8 *)(lVar112 + 0x10);
          uStack_2678 = *(undefined8 *)(lVar112 + 0x18);
          auVar205._0_4_ = fVar158 * (float)local_2730._0_4_ + fVar147 * auVar161._0_4_;
          auVar205._4_4_ = fVar159 * (float)local_2730._4_4_ + fVar155 * auVar161._4_4_;
          auVar205._8_4_ = fVar145 * fStack_2728 + fVar156 * auVar161._8_4_;
          auVar205._12_4_ = fVar146 * fStack_2724 + fVar157 * auVar161._12_4_;
          auVar131._0_4_ = fVar158 * (float)local_28a0._0_4_ + fVar147 * auVar80._0_4_;
          auVar131._4_4_ = fVar159 * (float)local_28a0._4_4_ + fVar155 * auVar80._4_4_;
          auVar131._8_4_ = fVar145 * fStack_2898 + fVar156 * auVar80._8_4_;
          auVar131._12_4_ = fVar146 * fStack_2894 + fVar157 * auVar80._12_4_;
          uStack_2670 = local_2680;
          uStack_2668 = uStack_2678;
          auVar139._16_16_ = auVar183;
          auVar139._0_16_ = auVar183;
          auVar152._16_16_ = auVar149;
          auVar152._0_16_ = auVar149;
          auVar184._16_16_ = auVar216;
          auVar184._0_16_ = auVar216;
          auVar193._16_16_ = auVar218;
          auVar193._0_16_ = auVar218;
          auVar201._16_16_ = auVar205;
          auVar201._0_16_ = auVar205;
          auVar132._16_16_ = auVar131;
          auVar132._0_16_ = auVar131;
          local_28c0 = vsubps_avx(auVar170,auVar139);
          local_2800 = vsubps_avx(auVar176,auVar152);
          auVar150 = vsubps_avx(auVar180,auVar184);
          auVar167 = vsubps_avx(auVar193,auVar170);
          auVar75 = vsubps_avx(auVar201,auVar176);
          auVar76 = vsubps_avx(auVar132,auVar180);
          fVar157 = auVar76._0_4_;
          fVar204 = local_2800._0_4_;
          fVar15 = auVar76._4_4_;
          fVar208 = local_2800._4_4_;
          auVar84._4_4_ = fVar208 * fVar15;
          auVar84._0_4_ = fVar204 * fVar157;
          fVar25 = auVar76._8_4_;
          fVar209 = local_2800._8_4_;
          auVar84._8_4_ = fVar209 * fVar25;
          fVar35 = auVar76._12_4_;
          fVar210 = local_2800._12_4_;
          auVar84._12_4_ = fVar210 * fVar35;
          fVar45 = auVar76._16_4_;
          fVar211 = local_2800._16_4_;
          auVar84._16_4_ = fVar211 * fVar45;
          fVar55 = auVar76._20_4_;
          fVar212 = local_2800._20_4_;
          auVar84._20_4_ = fVar212 * fVar55;
          fVar65 = auVar76._24_4_;
          fVar213 = local_2800._24_4_;
          auVar84._24_4_ = fVar213 * fVar65;
          auVar84._28_4_ = auVar131._12_4_;
          fVar158 = auVar75._0_4_;
          fVar182 = auVar150._0_4_;
          fVar16 = auVar75._4_4_;
          fVar187 = auVar150._4_4_;
          auVar85._4_4_ = fVar187 * fVar16;
          auVar85._0_4_ = fVar182 * fVar158;
          fVar26 = auVar75._8_4_;
          fVar188 = auVar150._8_4_;
          auVar85._8_4_ = fVar188 * fVar26;
          fVar36 = auVar75._12_4_;
          fVar189 = auVar150._12_4_;
          auVar85._12_4_ = fVar189 * fVar36;
          fVar46 = auVar75._16_4_;
          fVar190 = auVar150._16_4_;
          auVar85._16_4_ = fVar190 * fVar46;
          fVar56 = auVar75._20_4_;
          fVar191 = auVar150._20_4_;
          auVar85._20_4_ = fVar191 * fVar56;
          fVar66 = auVar75._24_4_;
          fVar192 = auVar150._24_4_;
          auVar85._24_4_ = fVar192 * fVar66;
          auVar85._28_4_ = auVar183._12_4_;
          local_2780 = vsubps_avx(auVar85,auVar84);
          fVar159 = auVar167._0_4_;
          fVar17 = auVar167._4_4_;
          auVar86._4_4_ = fVar187 * fVar17;
          auVar86._0_4_ = fVar182 * fVar159;
          fVar27 = auVar167._8_4_;
          auVar86._8_4_ = fVar188 * fVar27;
          fVar37 = auVar167._12_4_;
          auVar86._12_4_ = fVar189 * fVar37;
          fVar47 = auVar167._16_4_;
          auVar86._16_4_ = fVar190 * fVar47;
          fVar57 = auVar167._20_4_;
          auVar86._20_4_ = fVar191 * fVar57;
          fVar67 = auVar167._24_4_;
          auVar86._24_4_ = fVar192 * fVar67;
          auVar86._28_4_ = auVar183._12_4_;
          fVar145 = local_28c0._0_4_;
          fVar18 = local_28c0._4_4_;
          auVar87._4_4_ = fVar15 * fVar18;
          auVar87._0_4_ = fVar157 * fVar145;
          fVar28 = local_28c0._8_4_;
          auVar87._8_4_ = fVar25 * fVar28;
          fVar38 = local_28c0._12_4_;
          auVar87._12_4_ = fVar35 * fVar38;
          fVar48 = local_28c0._16_4_;
          auVar87._16_4_ = fVar45 * fVar48;
          fVar58 = local_28c0._20_4_;
          auVar87._20_4_ = fVar55 * fVar58;
          fVar68 = local_28c0._24_4_;
          auVar87._24_4_ = fVar65 * fVar68;
          auVar87._28_4_ = auVar149._12_4_;
          auVar150 = vsubps_avx(auVar87,auVar86);
          auVar88._4_4_ = fVar16 * fVar18;
          auVar88._0_4_ = fVar158 * fVar145;
          auVar88._8_4_ = fVar26 * fVar28;
          auVar88._12_4_ = fVar36 * fVar38;
          auVar88._16_4_ = fVar46 * fVar48;
          auVar88._20_4_ = fVar56 * fVar58;
          auVar88._24_4_ = fVar66 * fVar68;
          auVar88._28_4_ = auVar149._12_4_;
          auVar89._4_4_ = fVar208 * fVar17;
          auVar89._0_4_ = fVar204 * fVar159;
          auVar89._8_4_ = fVar209 * fVar27;
          auVar89._12_4_ = fVar210 * fVar37;
          auVar89._16_4_ = fVar211 * fVar47;
          auVar89._20_4_ = fVar212 * fVar57;
          auVar89._24_4_ = fVar213 * fVar67;
          auVar89._28_4_ = local_2800._28_4_;
          local_28e0 = vsubps_avx(auVar89,auVar88);
          uVar3 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
          auVar206._4_4_ = uVar3;
          auVar206._0_4_ = uVar3;
          auVar206._8_4_ = uVar3;
          auVar206._12_4_ = uVar3;
          auVar206._16_4_ = uVar3;
          auVar206._20_4_ = uVar3;
          auVar206._24_4_ = uVar3;
          auVar206._28_4_ = uVar3;
          uVar3 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
          auVar214._4_4_ = uVar3;
          auVar214._0_4_ = uVar3;
          auVar214._8_4_ = uVar3;
          auVar214._12_4_ = uVar3;
          auVar214._16_4_ = uVar3;
          auVar214._20_4_ = uVar3;
          auVar214._24_4_ = uVar3;
          auVar214._28_4_ = uVar3;
          uVar4 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
          auVar217._4_4_ = uVar4;
          auVar217._0_4_ = uVar4;
          auVar217._8_4_ = uVar4;
          auVar217._12_4_ = uVar4;
          auVar217._16_4_ = uVar4;
          auVar217._20_4_ = uVar4;
          auVar217._24_4_ = uVar4;
          auVar217._28_4_ = uVar4;
          fVar147 = (ray->super_RayK<1>).dir.field_0.m128[1];
          local_27a0 = vsubps_avx(auVar170,auVar206);
          fVar155 = (ray->super_RayK<1>).dir.field_0.m128[2];
          auVar77 = vsubps_avx(auVar176,auVar214);
          auVar177 = ZEXT3264(auVar77);
          auVar78 = vsubps_avx(auVar180,auVar217);
          fVar146 = auVar78._0_4_;
          fVar19 = auVar78._4_4_;
          auVar90._4_4_ = fVar147 * fVar19;
          auVar90._0_4_ = fVar147 * fVar146;
          fVar29 = auVar78._8_4_;
          auVar90._8_4_ = fVar147 * fVar29;
          fVar39 = auVar78._12_4_;
          auVar90._12_4_ = fVar147 * fVar39;
          fVar49 = auVar78._16_4_;
          auVar90._16_4_ = fVar147 * fVar49;
          fVar59 = auVar78._20_4_;
          auVar90._20_4_ = fVar147 * fVar59;
          fVar69 = auVar78._24_4_;
          auVar90._24_4_ = fVar147 * fVar69;
          auVar90._28_4_ = uVar3;
          fVar154 = auVar77._0_4_;
          fVar20 = auVar77._4_4_;
          auVar91._4_4_ = fVar155 * fVar20;
          auVar91._0_4_ = fVar155 * fVar154;
          fVar30 = auVar77._8_4_;
          auVar91._8_4_ = fVar155 * fVar30;
          fVar40 = auVar77._12_4_;
          auVar91._12_4_ = fVar155 * fVar40;
          fVar50 = auVar77._16_4_;
          auVar91._16_4_ = fVar155 * fVar50;
          fVar60 = auVar77._20_4_;
          auVar91._20_4_ = fVar155 * fVar60;
          fVar70 = auVar77._24_4_;
          auVar91._24_4_ = fVar155 * fVar70;
          auVar91._28_4_ = uVar4;
          auVar77 = vsubps_avx(auVar91,auVar90);
          fVar156 = (ray->super_RayK<1>).dir.field_0.m128[0];
          fVar11 = local_27a0._0_4_;
          fVar21 = local_27a0._4_4_;
          auVar92._4_4_ = fVar155 * fVar21;
          auVar92._0_4_ = fVar155 * fVar11;
          fVar31 = local_27a0._8_4_;
          auVar92._8_4_ = fVar155 * fVar31;
          fVar41 = local_27a0._12_4_;
          auVar92._12_4_ = fVar155 * fVar41;
          fVar51 = local_27a0._16_4_;
          auVar92._16_4_ = fVar155 * fVar51;
          fVar61 = local_27a0._20_4_;
          auVar92._20_4_ = fVar155 * fVar61;
          fVar71 = local_27a0._24_4_;
          auVar92._24_4_ = fVar155 * fVar71;
          auVar92._28_4_ = local_2780._28_4_;
          auVar93._4_4_ = fVar156 * fVar19;
          auVar93._0_4_ = fVar156 * fVar146;
          auVar93._8_4_ = fVar156 * fVar29;
          auVar93._12_4_ = fVar156 * fVar39;
          auVar93._16_4_ = fVar156 * fVar49;
          auVar93._20_4_ = fVar156 * fVar59;
          auVar93._24_4_ = fVar156 * fVar69;
          auVar93._28_4_ = auVar183._12_4_;
          auVar78 = vsubps_avx(auVar93,auVar92);
          auVar94._4_4_ = fVar156 * fVar20;
          auVar94._0_4_ = fVar156 * fVar154;
          auVar94._8_4_ = fVar156 * fVar30;
          auVar94._12_4_ = fVar156 * fVar40;
          auVar94._16_4_ = fVar156 * fVar50;
          auVar94._20_4_ = fVar156 * fVar60;
          auVar94._24_4_ = fVar156 * fVar70;
          auVar94._28_4_ = auVar183._12_4_;
          auVar95._4_4_ = fVar147 * fVar21;
          auVar95._0_4_ = fVar147 * fVar11;
          auVar95._8_4_ = fVar147 * fVar31;
          auVar95._12_4_ = fVar147 * fVar41;
          auVar95._16_4_ = fVar147 * fVar51;
          auVar95._20_4_ = fVar147 * fVar61;
          auVar95._24_4_ = fVar147 * fVar71;
          auVar95._28_4_ = local_27a0._28_4_;
          auVar79 = vsubps_avx(auVar95,auVar94);
          fVar12 = local_28e0._0_4_;
          fVar22 = local_28e0._4_4_;
          fVar32 = local_28e0._8_4_;
          fVar42 = local_28e0._12_4_;
          fVar52 = local_28e0._16_4_;
          fVar62 = local_28e0._20_4_;
          fVar72 = local_28e0._24_4_;
          fVar13 = auVar150._0_4_;
          fVar23 = auVar150._4_4_;
          fVar33 = auVar150._8_4_;
          fVar43 = auVar150._12_4_;
          fVar53 = auVar150._16_4_;
          fVar63 = auVar150._20_4_;
          fVar73 = auVar150._24_4_;
          auVar166 = ZEXT3264(local_2780);
          fVar14 = local_2780._0_4_;
          fVar24 = local_2780._4_4_;
          fVar34 = local_2780._8_4_;
          fVar44 = local_2780._12_4_;
          fVar54 = local_2780._16_4_;
          fVar64 = local_2780._20_4_;
          fVar74 = local_2780._24_4_;
          auVar153._0_4_ = fVar156 * fVar14 + fVar147 * fVar13 + fVar155 * fVar12;
          auVar153._4_4_ = fVar156 * fVar24 + fVar147 * fVar23 + fVar155 * fVar22;
          auVar153._8_4_ = fVar156 * fVar34 + fVar147 * fVar33 + fVar155 * fVar32;
          auVar153._12_4_ = fVar156 * fVar44 + fVar147 * fVar43 + fVar155 * fVar42;
          auVar153._16_4_ = fVar156 * fVar54 + fVar147 * fVar53 + fVar155 * fVar52;
          auVar153._20_4_ = fVar156 * fVar64 + fVar147 * fVar63 + fVar155 * fVar62;
          auVar153._24_4_ = fVar156 * fVar74 + fVar147 * fVar73 + fVar155 * fVar72;
          auVar153._28_4_ = fVar155 + fVar155 + local_27a0._28_4_;
          auVar140._8_4_ = 0x80000000;
          auVar140._0_8_ = 0x8000000080000000;
          auVar140._12_4_ = 0x80000000;
          auVar140._16_4_ = 0x80000000;
          auVar140._20_4_ = 0x80000000;
          auVar140._24_4_ = 0x80000000;
          auVar140._28_4_ = 0x80000000;
          auVar150 = vandps_avx(auVar153,auVar140);
          uVar122 = auVar150._0_4_;
          auVar178._0_4_ =
               (float)(uVar122 ^
                      (uint)(fVar159 * auVar77._0_4_ +
                            fVar158 * auVar78._0_4_ + fVar157 * auVar79._0_4_));
          uVar195 = auVar150._4_4_;
          auVar178._4_4_ =
               (float)(uVar195 ^
                      (uint)(fVar17 * auVar77._4_4_ +
                            fVar16 * auVar78._4_4_ + fVar15 * auVar79._4_4_));
          uVar114 = auVar150._8_4_;
          auVar178._8_4_ =
               (float)(uVar114 ^
                      (uint)(fVar27 * auVar77._8_4_ +
                            fVar26 * auVar78._8_4_ + fVar25 * auVar79._8_4_));
          uVar196 = auVar150._12_4_;
          auVar178._12_4_ =
               (float)(uVar196 ^
                      (uint)(fVar37 * auVar77._12_4_ +
                            fVar36 * auVar78._12_4_ + fVar35 * auVar79._12_4_));
          uVar197 = auVar150._16_4_;
          auVar178._16_4_ =
               (float)(uVar197 ^
                      (uint)(fVar47 * auVar77._16_4_ +
                            fVar46 * auVar78._16_4_ + fVar45 * auVar79._16_4_));
          uVar198 = auVar150._20_4_;
          auVar178._20_4_ =
               (float)(uVar198 ^
                      (uint)(fVar57 * auVar77._20_4_ +
                            fVar56 * auVar78._20_4_ + fVar55 * auVar79._20_4_));
          uVar199 = auVar150._24_4_;
          auVar178._24_4_ =
               (float)(uVar199 ^
                      (uint)(fVar67 * auVar77._24_4_ +
                            fVar66 * auVar78._24_4_ + fVar65 * auVar79._24_4_));
          uVar200 = auVar150._28_4_;
          auVar178._28_4_ =
               (float)(uVar200 ^ (uint)(auVar167._28_4_ + auVar75._28_4_ + auVar76._28_4_));
          auVar185._0_4_ =
               (float)(uVar122 ^
                      (uint)(auVar77._0_4_ * fVar145 +
                            auVar78._0_4_ * fVar204 + fVar182 * auVar79._0_4_));
          auVar185._4_4_ =
               (float)(uVar195 ^
                      (uint)(auVar77._4_4_ * fVar18 +
                            auVar78._4_4_ * fVar208 + fVar187 * auVar79._4_4_));
          auVar185._8_4_ =
               (float)(uVar114 ^
                      (uint)(auVar77._8_4_ * fVar28 +
                            auVar78._8_4_ * fVar209 + fVar188 * auVar79._8_4_));
          auVar185._12_4_ =
               (float)(uVar196 ^
                      (uint)(auVar77._12_4_ * fVar38 +
                            auVar78._12_4_ * fVar210 + fVar189 * auVar79._12_4_));
          auVar185._16_4_ =
               (float)(uVar197 ^
                      (uint)(auVar77._16_4_ * fVar48 +
                            auVar78._16_4_ * fVar211 + fVar190 * auVar79._16_4_));
          auVar185._20_4_ =
               (float)(uVar198 ^
                      (uint)(auVar77._20_4_ * fVar58 +
                            auVar78._20_4_ * fVar212 + fVar191 * auVar79._20_4_));
          auVar185._24_4_ =
               (float)(uVar199 ^
                      (uint)(auVar77._24_4_ * fVar68 +
                            auVar78._24_4_ * fVar213 + fVar192 * auVar79._24_4_));
          auVar185._28_4_ = (float)(uVar200 ^ (uint)(auVar78._28_4_ + auVar79._28_4_ + -0.0));
          auVar167 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar150 = vcmpps_avx(auVar178,auVar167,5);
          auVar167 = vcmpps_avx(auVar185,auVar167,5);
          auVar150 = vandps_avx(auVar150,auVar167);
          auVar141._8_4_ = 0x7fffffff;
          auVar141._0_8_ = 0x7fffffff7fffffff;
          auVar141._12_4_ = 0x7fffffff;
          auVar141._16_4_ = 0x7fffffff;
          auVar141._20_4_ = 0x7fffffff;
          auVar141._24_4_ = 0x7fffffff;
          auVar141._28_4_ = 0x7fffffff;
          local_2600 = vandps_avx(auVar153,auVar141);
          auVar171 = ZEXT3264(local_2600);
          auVar167 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar153,4);
          auVar150 = vandps_avx(auVar150,auVar167);
          auVar142._0_4_ = auVar185._0_4_ + auVar178._0_4_;
          auVar142._4_4_ = auVar185._4_4_ + auVar178._4_4_;
          auVar142._8_4_ = auVar185._8_4_ + auVar178._8_4_;
          auVar142._12_4_ = auVar185._12_4_ + auVar178._12_4_;
          auVar142._16_4_ = auVar185._16_4_ + auVar178._16_4_;
          auVar142._20_4_ = auVar185._20_4_ + auVar178._20_4_;
          auVar142._24_4_ = auVar185._24_4_ + auVar178._24_4_;
          auVar142._28_4_ = auVar185._28_4_ + auVar178._28_4_;
          auVar75 = vcmpps_avx(auVar142,local_2600,2);
          auVar167 = vandps_avx(auVar150,auVar75);
          auVar76 = local_26a0 & auVar167;
          context = local_28e8;
          if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar76 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar76 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar76 >> 0x7f,0) != '\0') ||
                (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar76 >> 0xbf,0) != '\0') ||
              (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar76[0x1f] < '\0') {
            auVar167 = vandps_avx(auVar167,local_26a0);
            local_2620._0_4_ =
                 (float)(uVar122 ^ (uint)(fVar14 * fVar11 + fVar13 * fVar154 + fVar146 * fVar12));
            local_2620._4_4_ =
                 (float)(uVar195 ^ (uint)(fVar24 * fVar21 + fVar23 * fVar20 + fVar19 * fVar22));
            local_2620._8_4_ =
                 (float)(uVar114 ^ (uint)(fVar34 * fVar31 + fVar33 * fVar30 + fVar29 * fVar32));
            local_2620._12_4_ =
                 (float)(uVar196 ^ (uint)(fVar44 * fVar41 + fVar43 * fVar40 + fVar39 * fVar42));
            local_2620._16_4_ =
                 (float)(uVar197 ^ (uint)(fVar54 * fVar51 + fVar53 * fVar50 + fVar49 * fVar52));
            local_2620._20_4_ =
                 (float)(uVar198 ^ (uint)(fVar64 * fVar61 + fVar63 * fVar60 + fVar59 * fVar62));
            local_2620._24_4_ =
                 (float)(uVar199 ^ (uint)(fVar74 * fVar71 + fVar73 * fVar70 + fVar69 * fVar72));
            local_2620._28_4_ = uVar200 ^ (uint)(auVar75._28_4_ + auVar75._28_4_ + auVar150._28_4_);
            auVar177 = ZEXT3264(local_2620);
            fVar147 = (ray->super_RayK<1>).org.field_0.m128[3];
            fVar155 = local_2600._0_4_;
            fVar156 = local_2600._4_4_;
            auVar96._4_4_ = fVar156 * fVar147;
            auVar96._0_4_ = fVar155 * fVar147;
            fVar157 = local_2600._8_4_;
            auVar96._8_4_ = fVar157 * fVar147;
            fVar158 = local_2600._12_4_;
            auVar96._12_4_ = fVar158 * fVar147;
            fVar159 = local_2600._16_4_;
            auVar96._16_4_ = fVar159 * fVar147;
            fVar145 = local_2600._20_4_;
            auVar96._20_4_ = fVar145 * fVar147;
            fVar146 = local_2600._24_4_;
            auVar96._24_4_ = fVar146 * fVar147;
            auVar96._28_4_ = fVar147;
            auVar150 = vcmpps_avx(auVar96,local_2620,1);
            fVar147 = (ray->super_RayK<1>).tfar;
            auVar97._4_4_ = fVar156 * fVar147;
            auVar97._0_4_ = fVar155 * fVar147;
            auVar97._8_4_ = fVar157 * fVar147;
            auVar97._12_4_ = fVar158 * fVar147;
            auVar97._16_4_ = fVar159 * fVar147;
            auVar97._20_4_ = fVar145 * fVar147;
            auVar97._24_4_ = fVar146 * fVar147;
            auVar97._28_4_ = fVar147;
            auVar75 = vcmpps_avx(local_2620,auVar97,2);
            auVar150 = vandps_avx(auVar75,auVar150);
            auVar166 = ZEXT3264(auVar150);
            auVar75 = auVar167 & auVar150;
            if ((((((((auVar75 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar75 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar75 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar75 >> 0x7f,0) != '\0') ||
                  (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar75 >> 0xbf,0) != '\0') ||
                (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar75[0x1f] < '\0') {
              auVar75 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
              auVar135 = ZEXT3264(auVar75);
              auVar150 = vandps_avx(auVar167,auVar150);
              auVar167 = vsubps_avx(local_2600,auVar185);
              local_2660 = vblendvps_avx(auVar178,auVar167,local_24c0);
              local_25c0 = auVar150;
              auVar167 = vsubps_avx(local_2600,auVar178);
              local_2640 = vblendvps_avx(auVar185,auVar167,local_24c0);
              uStack_2524 = local_24c0._28_4_;
              local_2540[0] = fVar14 * (float)local_24e0._0_4_;
              local_2540[1] = fVar24 * (float)local_24e0._4_4_;
              local_2540[2] = fVar34 * fStack_24d8;
              local_2540[3] = fVar44 * fStack_24d4;
              fStack_2530 = fVar54 * fStack_24d0;
              fStack_252c = fVar64 * fStack_24cc;
              fStack_2528 = fVar74 * fStack_24c8;
              local_2520[0] = fVar13 * (float)local_24e0._0_4_;
              local_2520[1] = fVar23 * (float)local_24e0._4_4_;
              local_2520[2] = fVar33 * fStack_24d8;
              local_2520[3] = fVar43 * fStack_24d4;
              fStack_2510 = fVar53 * fStack_24d0;
              fStack_250c = fVar63 * fStack_24cc;
              fStack_2508 = fVar73 * fStack_24c8;
              uStack_2504 = uStack_2524;
              local_2500[0] = (float)local_24e0._0_4_ * fVar12;
              local_2500[1] = (float)local_24e0._4_4_ * fVar22;
              local_2500[2] = fStack_24d8 * fVar32;
              local_2500[3] = fStack_24d4 * fVar42;
              fStack_24f0 = fStack_24d0 * fVar52;
              fStack_24ec = fStack_24cc * fVar62;
              fStack_24e8 = fStack_24c8 * fVar72;
              uStack_24e4 = uStack_2524;
              local_2760 = auVar150;
              auVar167 = vrcpps_avx(local_2600);
              fVar147 = auVar167._0_4_;
              fVar154 = auVar167._4_4_;
              auVar98._4_4_ = fVar156 * fVar154;
              auVar98._0_4_ = fVar155 * fVar147;
              fVar155 = auVar167._8_4_;
              auVar98._8_4_ = fVar157 * fVar155;
              fVar156 = auVar167._12_4_;
              auVar98._12_4_ = fVar158 * fVar156;
              fVar157 = auVar167._16_4_;
              auVar98._16_4_ = fVar159 * fVar157;
              fVar158 = auVar167._20_4_;
              auVar98._20_4_ = fVar145 * fVar158;
              fVar159 = auVar167._24_4_;
              auVar98._24_4_ = fVar146 * fVar159;
              auVar98._28_4_ = local_2600._28_4_;
              auVar179._8_4_ = 0x3f800000;
              auVar179._0_8_ = 0x3f8000003f800000;
              auVar179._12_4_ = 0x3f800000;
              auVar179._16_4_ = 0x3f800000;
              auVar179._20_4_ = 0x3f800000;
              auVar179._24_4_ = 0x3f800000;
              auVar179._28_4_ = 0x3f800000;
              auVar167 = vsubps_avx(auVar179,auVar98);
              fVar147 = fVar147 + fVar147 * auVar167._0_4_;
              fVar154 = fVar154 + fVar154 * auVar167._4_4_;
              fVar155 = fVar155 + fVar155 * auVar167._8_4_;
              fVar156 = fVar156 + fVar156 * auVar167._12_4_;
              fVar157 = fVar157 + fVar157 * auVar167._16_4_;
              fVar158 = fVar158 + fVar158 * auVar167._20_4_;
              fVar159 = fVar159 + fVar159 * auVar167._24_4_;
              local_2560._4_4_ = fVar154 * local_2620._4_4_;
              local_2560._0_4_ = fVar147 * local_2620._0_4_;
              local_2560._8_4_ = fVar155 * local_2620._8_4_;
              local_2560._12_4_ = fVar156 * local_2620._12_4_;
              local_2560._16_4_ = fVar157 * local_2620._16_4_;
              local_2560._20_4_ = fVar158 * local_2620._20_4_;
              local_2560._24_4_ = fVar159 * local_2620._24_4_;
              local_2560._28_4_ = auVar167._28_4_;
              auVar171 = ZEXT3264(local_2560);
              local_25a0[0] = local_2660._0_4_ * fVar147;
              local_25a0[1] = local_2660._4_4_ * fVar154;
              local_25a0[2] = local_2660._8_4_ * fVar155;
              local_25a0[3] = local_2660._12_4_ * fVar156;
              fStack_2590 = local_2660._16_4_ * fVar157;
              fStack_258c = local_2660._20_4_ * fVar158;
              fStack_2588 = local_2660._24_4_ * fVar159;
              uStack_2584 = local_2660._28_4_;
              local_2580[0] = local_2640._0_4_ * fVar147;
              local_2580[1] = local_2640._4_4_ * fVar154;
              local_2580[2] = local_2640._8_4_ * fVar155;
              local_2580[3] = local_2640._12_4_ * fVar156;
              fStack_2570 = local_2640._16_4_ * fVar157;
              fStack_256c = local_2640._20_4_ * fVar158;
              fStack_2568 = local_2640._24_4_ * fVar159;
              uStack_2564 = local_2660._28_4_;
              auVar133._8_4_ = 0x7f800000;
              auVar133._0_8_ = 0x7f8000007f800000;
              auVar133._12_4_ = 0x7f800000;
              auVar133._16_4_ = 0x7f800000;
              auVar133._20_4_ = 0x7f800000;
              auVar133._24_4_ = 0x7f800000;
              auVar133._28_4_ = 0x7f800000;
              auVar167 = vblendvps_avx(auVar133,local_2560,auVar150);
              auVar76 = vshufps_avx(auVar167,auVar167,0xb1);
              auVar76 = vminps_avx(auVar167,auVar76);
              auVar77 = vshufpd_avx(auVar76,auVar76,5);
              auVar76 = vminps_avx(auVar76,auVar77);
              auVar77 = vperm2f128_avx(auVar76,auVar76,1);
              auVar76 = vminps_avx(auVar76,auVar77);
              auVar167 = vcmpps_avx(auVar167,auVar76,0);
              auVar76 = auVar150 & auVar167;
              if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar76 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar76 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar76 >> 0x7f,0) != '\0') ||
                    (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar76 >> 0xbf,0) != '\0') ||
                  (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar76[0x1f] < '\0') {
                auVar150 = vandps_avx(auVar167,auVar150);
              }
              uVar122 = vextractps_avx(auVar75._0_16_,1);
              uVar114 = vmovmskps_avx(auVar150);
              uVar195 = 0;
              _local_28a0 = auVar99;
              _local_2890 = auVar100;
              _local_2740 = auVar101;
              _local_2730 = auVar102;
              _local_2720 = auVar103;
              _local_2710 = auVar104;
              _local_2700 = auVar105;
              _local_26f0 = auVar106;
              _local_26e0 = auVar107;
              _local_26d0 = auVar108;
              _local_26c0 = auVar109;
              if (uVar114 != 0) {
                for (; (uVar114 >> uVar195 & 1) == 0; uVar195 = uVar195 + 1) {
                }
              }
LAB_00e6d962:
              auVar166 = ZEXT3264(auVar150);
              uVar117 = CONCAT44(0,uVar195);
              local_27b8 = *(uint *)((long)&local_23c0 + uVar117 * 4);
              pGVar8 = (pSVar6->geometries).items[local_27b8].ptr;
              if ((pGVar8->mask & uVar122) == 0) {
                *(undefined4 *)(local_2760 + uVar117 * 4) = 0;
              }
              else {
                local_28e0 = auVar135._0_32_;
                local_2800 = auVar171._0_32_;
                if (context->args->filter == (RTCFilterFunctionN)0x0) {
                  local_2830.context = context->user;
                  if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                    fVar147 = local_25a0[uVar117];
                    fVar155 = local_2580[uVar117];
                    (ray->super_RayK<1>).tfar = local_2540[uVar117 - 8];
                    (ray->Ng).field_0.field_0.x = local_2540[uVar117];
                    (ray->Ng).field_0.field_0.y = local_2520[uVar117];
                    (ray->Ng).field_0.field_0.z = local_2500[uVar117];
                    ray->u = fVar147;
                    ray->v = fVar155;
                    ray->primID = *(uint *)((long)&local_2680 + uVar117 * 4);
                    ray->geomID = local_27b8;
                    ray->instID[0] = (local_2830.context)->instID[0];
                    ray->instPrimID[0] = (local_2830.context)->instPrimID[0];
                    goto LAB_00e6d790;
                  }
                }
                else {
                  local_2830.context = context->user;
                }
                local_28c0._0_8_ = context->args;
                local_27cc = local_2520[uVar117];
                auVar166 = ZEXT464((uint)local_27cc);
                local_27d0 = local_2540[uVar117];
                local_27c8 = local_2500[uVar117];
                local_27c4 = local_25a0[uVar117];
                local_27c0 = local_2580[uVar117];
                local_27bc = *(undefined4 *)((long)&local_2680 + uVar117 * 4);
                local_27b4 = (local_2830.context)->instID[0];
                local_27b0 = (local_2830.context)->instPrimID[0];
                local_2780._0_8_ = uVar117;
                (ray->super_RayK<1>).tfar = local_2540[uVar117 - 8];
                local_28ec = -1;
                local_2830.valid = &local_28ec;
                local_2830.geometryUserPtr = pGVar8->userPtr;
                local_2830.ray = (RTCRayN *)ray;
                local_2830.hit = (RTCHitN *)&local_27d0;
                local_2830.N = 1;
                local_27a0._0_8_ = pGVar8;
                if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00e6db4f:
                  if ((*(code **)(local_28c0._0_8_ + 0x10) != (code *)0x0) &&
                     (((*(byte *)local_28c0._0_8_ & 2) != 0 ||
                      ((*(byte *)(local_27a0._0_8_ + 0x3e) & 0x40) != 0)))) {
                    auVar166 = ZEXT1664(auVar166._0_16_);
                    auVar177 = ZEXT1664(auVar177._0_16_);
                    (**(code **)(local_28c0._0_8_ + 0x10))(&local_2830);
                    if (*local_2830.valid == 0) goto LAB_00e6dbea;
                  }
                  (((Vec3f *)((long)local_2830.ray + 0x30))->field_0).field_0.x =
                       *(float *)local_2830.hit;
                  (((Vec3f *)((long)local_2830.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_2830.hit + 4);
                  (((Vec3f *)((long)local_2830.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_2830.hit + 8);
                  *(float *)((long)local_2830.ray + 0x3c) = *(float *)(local_2830.hit + 0xc);
                  *(float *)((long)local_2830.ray + 0x40) = *(float *)(local_2830.hit + 0x10);
                  *(float *)((long)local_2830.ray + 0x44) = *(float *)(local_2830.hit + 0x14);
                  *(float *)((long)local_2830.ray + 0x48) = *(float *)(local_2830.hit + 0x18);
                  *(float *)((long)local_2830.ray + 0x4c) = *(float *)(local_2830.hit + 0x1c);
                  *(float *)((long)local_2830.ray + 0x50) = *(float *)(local_2830.hit + 0x20);
                }
                else {
                  auVar166 = ZEXT464((uint)local_27cc);
                  auVar177 = ZEXT1664(auVar177._0_16_);
                  (*pGVar8->intersectionFilterN)(&local_2830);
                  if (*local_2830.valid != 0) goto LAB_00e6db4f;
LAB_00e6dbea:
                  (ray->super_RayK<1>).tfar = (float)local_28e0._0_4_;
                }
                *(undefined4 *)(local_2760 + local_2780._0_8_ * 4) = 0;
                fVar147 = (ray->super_RayK<1>).tfar;
                auVar134._4_4_ = fVar147;
                auVar134._0_4_ = fVar147;
                auVar134._8_4_ = fVar147;
                auVar134._12_4_ = fVar147;
                auVar134._16_4_ = fVar147;
                auVar134._20_4_ = fVar147;
                auVar134._24_4_ = fVar147;
                auVar134._28_4_ = fVar147;
                auVar171 = ZEXT3264(local_2800);
                auVar150 = vcmpps_avx(local_2800,auVar134,2);
                local_2760 = vandps_avx(auVar150,local_2760);
                uVar122 = (ray->super_RayK<1>).mask;
                auVar135 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
                context = local_28e8;
              }
              if ((((((((local_2760 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_2760 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_2760 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_2760 >> 0x7f,0) == '\0') &&
                    (local_2760 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_2760 >> 0xbf,0) == '\0') &&
                  (local_2760 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_2760[0x1f]) goto LAB_00e6d790;
              auVar143._8_4_ = 0x7f800000;
              auVar143._0_8_ = 0x7f8000007f800000;
              auVar143._12_4_ = 0x7f800000;
              auVar143._16_4_ = 0x7f800000;
              auVar143._20_4_ = 0x7f800000;
              auVar143._24_4_ = 0x7f800000;
              auVar143._28_4_ = 0x7f800000;
              auVar167 = vblendvps_avx(auVar143,auVar171._0_32_,local_2760);
              auVar150 = vshufps_avx(auVar167,auVar167,0xb1);
              auVar150 = vminps_avx(auVar167,auVar150);
              auVar75 = vshufpd_avx(auVar150,auVar150,5);
              auVar75 = vminps_avx(auVar150,auVar75);
              auVar150 = vperm2f128_avx(auVar75,auVar75,1);
              auVar75 = vminps_avx(auVar75,auVar150);
              auVar75 = vcmpps_avx(auVar167,auVar75,0);
              auVar76 = local_2760 & auVar75;
              auVar167 = local_2760;
              if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar76 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar76 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar76 >> 0x7f,0) != '\0') ||
                    (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar76 >> 0xbf,0) != '\0') ||
                  (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar76[0x1f] < '\0') {
                auVar167 = vandps_avx(auVar75,local_2760);
              }
              uVar114 = vmovmskps_avx(auVar167);
              uVar195 = 0;
              if (uVar114 != 0) {
                for (; (uVar114 >> uVar195 & 1) == 0; uVar195 = uVar195 + 1) {
                }
              }
              goto LAB_00e6d962;
            }
          }
LAB_00e6d790:
          auVar181 = ZEXT3264(local_23e0);
          auVar186 = ZEXT3264(local_2400);
          auVar194 = ZEXT3264(local_2420);
          auVar202 = ZEXT3264(local_2440);
          auVar203 = ZEXT3264(local_2460);
          auVar207 = ZEXT3264(local_2480);
          auVar215 = ZEXT3264(local_24a0);
          uVar117 = local_2880;
        }
        fVar147 = (ray->super_RayK<1>).tfar;
        auVar135 = ZEXT3264(CONCAT428(fVar147,CONCAT424(fVar147,CONCAT420(fVar147,CONCAT416(fVar147,
                                                  CONCAT412(fVar147,CONCAT48(fVar147,CONCAT44(
                                                  fVar147,fVar147))))))));
        auVar144 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
      }
      goto LAB_00e6cc66;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }